

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

char * print_value(cJSON *item,int depth,int fmt)

{
  double __x;
  uint uVar1;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  undefined8 *__s;
  void *__s_00;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  cJSON *pcVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  undefined8 *puVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  size_t sVar17;
  double dVar18;
  double dVar19;
  int local_78;
  
  if (item == (cJSON *)0x0) {
    return (char *)0x0;
  }
  uVar1 = item->type;
  if (7 < (byte)uVar1) {
    return (char *)0x0;
  }
  switch(uVar1 & 0xff) {
  case 0:
    pcVar5 = (char *)(*cJSON_malloc)(6);
    if (pcVar5 != (char *)0x0) {
      builtin_strncpy(pcVar5,"false",6);
      return pcVar5;
    }
    break;
  case 1:
    pcVar5 = (char *)(*cJSON_malloc)(5);
    if (pcVar5 != (char *)0x0) {
      builtin_strncpy(pcVar5,"true",5);
      return pcVar5;
    }
    break;
  case 2:
    pcVar5 = (char *)(*cJSON_malloc)(5);
    if (pcVar5 != (char *)0x0) {
      builtin_strncpy(pcVar5,"null",5);
      return pcVar5;
    }
    break;
  case 3:
    __x = item->valuedouble;
    if (((2.220446049250313e-16 < ABS((double)item->valueint - __x)) || (2147483647.0 < __x)) ||
       (__x < -2147483648.0)) {
      pcVar5 = (char *)(*cJSON_malloc)(0x40);
      if (pcVar5 != (char *)0x0) {
        dVar18 = floor(__x);
        dVar19 = ABS(__x);
        if ((2.220446049250313e-16 < ABS(dVar18 - __x)) || (1e+60 <= dVar19)) {
          if ((dVar19 < 1e-06) || (1000000000.0 < dVar19)) {
            pcVar6 = "%e";
          }
          else {
            pcVar6 = "%f";
          }
        }
        else {
          pcVar6 = "%.0f";
        }
        sprintf(pcVar5,pcVar6,__x);
        return pcVar5;
      }
    }
    else {
      pcVar5 = (char *)(*cJSON_malloc)(0x15);
      if (pcVar5 != (char *)0x0) {
        sprintf(pcVar5,"%d",(ulong)(uint)item->valueint);
        return pcVar5;
      }
    }
    break;
  default:
    pcVar5 = print_string_ptr(item->valuestring,(uint)(uVar1 == 4));
    return pcVar5;
  case 5:
    sVar17 = 0xfffffffffffffff8;
    uVar12 = 0;
    pcVar9 = (cJSON *)&item->child;
    do {
      pcVar9 = pcVar9->next;
      uVar12 = uVar12 - 1;
      sVar17 = sVar17 + 8;
    } while (pcVar9 != (cJSON *)0x0);
    if ((int)uVar12 == -1) {
      pcVar5 = (char *)(*cJSON_malloc)(3);
      if (pcVar5 != (char *)0x0) {
        pcVar5[2] = '\0';
        pcVar5[0] = '[';
        pcVar5[1] = ']';
        return pcVar5;
      }
      return (char *)0x0;
    }
    __s = (undefined8 *)(*cJSON_malloc)(sVar17);
    if (__s == (undefined8 *)0x0) {
      return (char *)0x0;
    }
    bVar4 = false;
    memset(__s,0,sVar17);
    pcVar9 = item->child;
    if (pcVar9 == (cJSON *)0x0) {
      bVar4 = true;
      sVar17 = 5;
      bVar3 = true;
    }
    else {
      local_78 = 3 - (uint)(fmt == 0);
      iVar15 = 5;
      puVar13 = __s;
      do {
        pcVar5 = print_value(pcVar9,depth + 1,fmt);
        *puVar13 = pcVar5;
        if (pcVar5 == (char *)0x0) {
          bVar4 = true;
        }
        else {
          sVar7 = strlen(pcVar5);
          iVar15 = iVar15 + local_78 + (int)sVar7;
        }
        pcVar9 = pcVar9->next;
        bVar3 = !bVar4;
      } while ((pcVar9 != (cJSON *)0x0) && (puVar13 = puVar13 + 1, !bVar4));
      sVar17 = (size_t)iVar15;
      bVar4 = !bVar4;
    }
    if (bVar3) {
      pcVar5 = (char *)(*cJSON_malloc)(sVar17);
    }
    else {
      pcVar5 = (char *)0x0;
    }
    uVar16 = ~uVar12;
    if ((bool)(pcVar5 != (char *)0x0 & bVar4)) {
      pcVar5[0] = '[';
      pcVar5[1] = '\0';
      pcVar6 = pcVar5 + 1;
      uVar14 = 0;
      do {
        strcpy(pcVar6,(char *)__s[uVar14]);
        sVar7 = strlen((char *)__s[uVar14]);
        pcVar6 = pcVar6 + sVar7;
        if (-(int)uVar12 - 2 != uVar14) {
          *pcVar6 = ',';
          if (fmt == 0) {
            pcVar6 = pcVar6 + 1;
          }
          else {
            pcVar6[1] = ' ';
            pcVar6 = pcVar6 + 2;
          }
          *pcVar6 = '\0';
        }
        (*cJSON_free)((void *)__s[uVar14]);
        uVar14 = uVar14 + 1;
      } while (uVar16 + (uVar16 == 0) != uVar14);
      (*cJSON_free)(__s);
      pcVar6[0] = ']';
      pcVar6[1] = '\0';
      return pcVar5;
    }
    lVar11 = 0;
    do {
      if ((void *)__s[lVar11] != (void *)0x0) {
        (*cJSON_free)((void *)__s[lVar11]);
      }
      lVar11 = lVar11 + 1;
    } while (uVar16 + (uVar16 == 0) != lVar11);
    goto LAB_0016dd0a;
  case 6:
    sVar17 = 0xfffffffffffffff8;
    uVar12 = 0;
    pcVar9 = (cJSON *)&item->child;
    do {
      pcVar9 = pcVar9->next;
      uVar12 = uVar12 - 1;
      sVar17 = sVar17 + 8;
    } while (pcVar9 != (cJSON *)0x0);
    if ((int)uVar12 == -1) {
      iVar15 = 3;
      if (fmt != 0) {
        iVar15 = depth + 4;
      }
      pcVar5 = (char *)(*cJSON_malloc)((long)iVar15);
      if (pcVar5 == (char *)0x0) {
        return (char *)0x0;
      }
      *pcVar5 = '{';
      if (fmt == 0) {
        pcVar6 = pcVar5 + 1;
      }
      else {
        pcVar6 = pcVar5 + 2;
        pcVar5[1] = '\n';
        if (1 < depth) {
          memset(pcVar6,9,(ulong)(depth - 1));
          pcVar6 = pcVar5 + (ulong)(depth - 2) + 3;
        }
      }
      pcVar6[0] = '}';
      pcVar6[1] = '\0';
      return pcVar5;
    }
    __s = (undefined8 *)(*cJSON_malloc)(sVar17);
    if (__s == (undefined8 *)0x0) {
      return (char *)0x0;
    }
    __s_00 = (*cJSON_malloc)(sVar17);
    if (__s_00 != (void *)0x0) {
      bVar4 = false;
      memset(__s,0,sVar17);
      memset(__s_00,0,sVar17);
      iVar15 = 7;
      if (fmt != 0) {
        iVar15 = depth + 8;
      }
      pcVar9 = item->child;
      if (pcVar9 == (cJSON *)0x0) {
        bVar4 = true;
      }
      else {
        iVar10 = 2;
        if (fmt != 0) {
          iVar10 = depth + 5;
        }
        lVar11 = 0;
        do {
          pcVar5 = print_string_ptr(pcVar9->string,1);
          *(char **)((long)__s_00 + lVar11) = pcVar5;
          pcVar6 = print_value(pcVar9,depth + 1U,fmt);
          *(char **)((long)__s + lVar11) = pcVar6;
          if (pcVar6 == (char *)0x0 || pcVar5 == (char *)0x0) {
            bVar4 = true;
          }
          else {
            sVar7 = strlen(pcVar6);
            sVar8 = strlen(pcVar5);
            iVar15 = iVar15 + iVar10 + (int)sVar8 + (int)sVar7;
          }
          pcVar9 = pcVar9->next;
          lVar11 = lVar11 + 8;
        } while (pcVar9 != (cJSON *)0x0);
        bVar4 = !bVar4;
      }
      if (bVar4) {
        pcVar5 = (char *)(*cJSON_malloc)((long)iVar15);
      }
      else {
        pcVar5 = (char *)0x0;
      }
      uVar16 = ~uVar12;
      if ((bool)(pcVar5 != (char *)0x0 & bVar4)) {
        *pcVar5 = '{';
        if (fmt == 0) {
          pcVar6 = pcVar5 + 1;
        }
        else {
          pcVar6 = pcVar5 + 2;
          pcVar5[1] = '\n';
        }
        *pcVar6 = '\0';
        uVar14 = 0;
        do {
          if (-1 < depth && fmt != 0) {
            memset(pcVar6,9,(ulong)(depth + 1U));
            pcVar6 = pcVar6 + (ulong)(uint)depth + 1;
          }
          strcpy(pcVar6,*(char **)((long)__s_00 + uVar14 * 8));
          sVar7 = strlen(*(char **)((long)__s_00 + uVar14 * 8));
          pcVar6[sVar7] = ':';
          if (fmt == 0) {
            lVar11 = sVar7 + 1;
          }
          else {
            pcVar6[sVar7 + 1] = '\t';
            lVar11 = sVar7 + 2;
          }
          strcpy(pcVar6 + lVar11,(char *)__s[uVar14]);
          sVar7 = strlen((char *)__s[uVar14]);
          pcVar6 = pcVar6 + lVar11 + sVar7;
          if ((-uVar12 - 2 & 0xffffffff) != uVar14) {
            *pcVar6 = ',';
            pcVar6 = pcVar6 + 1;
          }
          if (fmt != 0) {
            *pcVar6 = '\n';
            pcVar6 = pcVar6 + 1;
          }
          *pcVar6 = '\0';
          (*cJSON_free)(*(void **)((long)__s_00 + uVar14 * 8));
          (*cJSON_free)((void *)__s[uVar14]);
          uVar14 = uVar14 + 1;
        } while (uVar16 + (uVar16 == 0) != uVar14);
        (*cJSON_free)(__s_00);
        (*cJSON_free)(__s);
        if (0 < depth && fmt != 0) {
          memset(pcVar6,9,(ulong)(uint)depth);
          pcVar6 = pcVar6 + (ulong)(depth - 1) + 1;
        }
        pcVar6[0] = '}';
        pcVar6[1] = '\0';
        return pcVar5;
      }
      lVar11 = 0;
      do {
        pvVar2 = *(void **)((long)__s_00 + lVar11 * 8);
        if (pvVar2 != (void *)0x0) {
          (*cJSON_free)(pvVar2);
        }
        if ((void *)__s[lVar11] != (void *)0x0) {
          (*cJSON_free)((void *)__s[lVar11]);
        }
        lVar11 = lVar11 + 1;
      } while (uVar16 + (uVar16 == 0) != lVar11);
      (*cJSON_free)(__s_00);
    }
LAB_0016dd0a:
    (*cJSON_free)(__s);
  }
  return (char *)0x0;
}

Assistant:

static char *
print_value(cJSON *item, int depth, int fmt)
{
    char *out = 0;
    if (!item)
        return 0;
    switch ((item->type) & 255) {
        case cJSON_NULL:
            out = cJSON_strdup("null");
            break;
        case cJSON_False:
            out = cJSON_strdup("false");
            break;
        case cJSON_True:
            out = cJSON_strdup("true");
            break;
        case cJSON_Number:
            out = print_number(item);
            break;
        case cJSON_Array:
            out = print_array(item, depth, fmt);
            break;
        case cJSON_Object:
            out = print_object(item, depth, fmt);
            break;
        case cJSON_RawString:
        case cJSON_String:
            out = print_string(item);
            break;
    }
    return out;
}